

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exorUtil.c
# Opt level: O0

int WriteResultIntoFile(char *pFileName)

{
  tm *__tp;
  char *pcVar1;
  bool bVar2;
  char *TimeStr;
  time_t ltime;
  FILE *pFile;
  char *pFileName_local;
  
  pFile = (FILE *)pFileName;
  ltime = (time_t)fopen(pFileName,"w");
  bVar2 = (FILE *)ltime != (FILE *)0x0;
  if (bVar2) {
    time((time_t *)&TimeStr);
    __tp = localtime((time_t *)&TimeStr);
    pcVar1 = asctime(__tp);
    g_CoverInfo.nLiteralsAfter = CountLiteralsCheck();
    g_CoverInfo.QCostAfter = CountQCost();
    fprintf((FILE *)ltime,"# EXORCISM-4 output for command line arguments: ");
    fprintf((FILE *)ltime,"\"-Q %d -V %d\"\n",(ulong)(uint)g_CoverInfo.Quality,
            (ulong)(uint)g_CoverInfo.Verbosity);
    fprintf((FILE *)ltime,"# Minimization performed %s",pcVar1);
    fprintf((FILE *)ltime,"# Initial statistics: ");
    fprintf((FILE *)ltime,"Cubes = %d  Literals = %d  QCost = %d\n",
            (ulong)(uint)g_CoverInfo.nCubesBefore,(ulong)(uint)g_CoverInfo.nLiteralsBefore,
            (ulong)(uint)g_CoverInfo.QCostBefore);
    fprintf((FILE *)ltime,"# Final   statistics: ");
    fprintf((FILE *)ltime,"Cubes = %d  Literals = %d  QCost = %d\n",
            (ulong)(uint)g_CoverInfo.nCubesInUse,(ulong)(uint)g_CoverInfo.nLiteralsAfter,
            (ulong)(uint)g_CoverInfo.QCostAfter);
    fprintf((FILE *)ltime,"# File reading and reordering time = %.2f sec\n",
            (double)((float)g_CoverInfo.TimeRead / 1e+06));
    fprintf((FILE *)ltime,"# Starting cover generation time   = %.2f sec\n",
            (double)((float)g_CoverInfo.TimeStart / 1e+06));
    fprintf((FILE *)ltime,"# Pure ESOP minimization time      = %.2f sec\n",
            (double)((float)g_CoverInfo.TimeMin / 1e+06));
    fprintf((FILE *)ltime,".i %d\n",(ulong)(uint)g_CoverInfo.nVarsIn);
    fprintf((FILE *)ltime,".o %d\n",(ulong)(uint)g_CoverInfo.nVarsOut);
    fprintf((FILE *)ltime,".p %d\n",(ulong)(uint)g_CoverInfo.nCubesInUse);
    fprintf((FILE *)ltime,".type esop\n");
    WriteTableIntoFile((FILE *)ltime);
    fprintf((FILE *)ltime,".e\n");
    fclose((FILE *)ltime);
  }
  else {
    fprintf((FILE *)0x0,"\n\nCannot open the output file\n");
  }
  pFileName_local._4_4_ = (uint)!bVar2;
  return pFileName_local._4_4_;
}

Assistant:

int WriteResultIntoFile( char * pFileName )
// write the ESOP cover into the PLA file <NewFileName>
{
    FILE * pFile;
    time_t ltime;
    char * TimeStr;

    pFile = fopen( pFileName, "w" );
    if ( pFile == NULL )
    {
        fprintf( pFile, "\n\nCannot open the output file\n" );
        return 1;
    }

    // get current time
    time( &ltime );
    TimeStr = asctime( localtime( &ltime ) );
    // get the number of literals
    g_CoverInfo.nLiteralsAfter = CountLiteralsCheck();
    g_CoverInfo.QCostAfter = CountQCost();
    fprintf( pFile, "# EXORCISM-4 output for command line arguments: " );
    fprintf( pFile, "\"-Q %d -V %d\"\n", g_CoverInfo.Quality, g_CoverInfo.Verbosity );
    fprintf( pFile, "# Minimization performed %s", TimeStr );
    fprintf( pFile, "# Initial statistics: " );
    fprintf( pFile, "Cubes = %d  Literals = %d  QCost = %d\n", g_CoverInfo.nCubesBefore, g_CoverInfo.nLiteralsBefore, g_CoverInfo.QCostBefore );
    fprintf( pFile, "# Final   statistics: " );
    fprintf( pFile, "Cubes = %d  Literals = %d  QCost = %d\n", g_CoverInfo.nCubesInUse, g_CoverInfo.nLiteralsAfter, g_CoverInfo.QCostAfter );
    fprintf( pFile, "# File reading and reordering time = %.2f sec\n", TICKS_TO_SECONDS(g_CoverInfo.TimeRead) );
    fprintf( pFile, "# Starting cover generation time   = %.2f sec\n", TICKS_TO_SECONDS(g_CoverInfo.TimeStart) );
    fprintf( pFile, "# Pure ESOP minimization time      = %.2f sec\n", TICKS_TO_SECONDS(g_CoverInfo.TimeMin) );
    fprintf( pFile, ".i %d\n", g_CoverInfo.nVarsIn );
    fprintf( pFile, ".o %d\n", g_CoverInfo.nVarsOut );
    fprintf( pFile, ".p %d\n", g_CoverInfo.nCubesInUse );
    fprintf( pFile, ".type esop\n" );
    WriteTableIntoFile( pFile );
    fprintf( pFile, ".e\n" );
    fclose( pFile );
    return 0;
}